

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_2_symbolic_unary(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = PVIP_node_new_children1(&G->data,PVIP_NODE_UNARY_MINUS,G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_2_symbolic_unary(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define f1 G->val[-1]
  yyprintf((stderr, "do yy_2_symbolic_unary"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_UNARY_MINUS, f1); }\n"));
  yy = PVIP_node_new_children1(&(G->data), PVIP_NODE_UNARY_MINUS, f1); ;
#undef f1
}